

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_command_line.cpp
# Opt level: O2

void __thiscall
ClCommandLine_TwoPositionals_Test::~ClCommandLine_TwoPositionals_Test
          (ClCommandLine_TwoPositionals_Test *this)

{
  anon_unknown.dwarf_1ee32::ClCommandLine::~ClCommandLine(&this->super_ClCommandLine);
  operator_delete(this,0x28);
  return;
}

Assistant:

TEST_F (ClCommandLine, TwoPositionals) {
    opt<std::string> opt1 ("opt1", positional);
    opt<std::string> opt2 ("opt2", positional);

    this->add ("progname", "arg1", "arg2");

    string_stream output;
    string_stream errors;
    bool const res = this->parse_command_line_options (output, errors);
    EXPECT_TRUE (res);

    EXPECT_EQ (errors.str ().length (), 0U);
    EXPECT_EQ (output.str ().length (), 0U);

    EXPECT_EQ (opt1.get (), "arg1");
    EXPECT_EQ (opt2.get (), "arg2");
}